

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

void __thiscall cmFileAPI::WriteReplies(cmFileAPI *this)

{
  allocator<char> local_a9;
  string local_a8;
  Value local_88;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmFileAPI *local_10;
  cmFileAPI *this_local;
  
  local_10 = this;
  if ((this->QueryExists & 1U) != 0) {
    std::operator+(&local_30,&this->APIv1,"/reply");
    cmsys::SystemTools::MakeDirectory(&local_30,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&local_30);
    BuildReplyIndex(&local_88,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"index",&local_a9);
    WriteJsonFile(&local_60,this,&local_88,&local_a8,ComputeSuffixTime);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    Json::Value::~Value(&local_88);
  }
  RemoveOldReplyFiles(this);
  return;
}

Assistant:

void cmFileAPI::WriteReplies()
{
  if (this->QueryExists) {
    cmSystemTools::MakeDirectory(this->APIv1 + "/reply");
    this->WriteJsonFile(this->BuildReplyIndex(), "index", ComputeSuffixTime);
  }

  this->RemoveOldReplyFiles();
}